

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O0

void __thiscall DummyTest_Copy_Test::~DummyTest_Copy_Test(DummyTest_Copy_Test *this)

{
  void *in_RDI;
  
  ~DummyTest_Copy_Test((DummyTest_Copy_Test *)0x16f168);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DummyTest, Copy) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
    }

    Deque<int> d2(d);
    auto p = std::mismatch(d.begin(), d.end(), d2.begin());
    ASSERT_EQ(p.first, d.end());

    d[3] = 5;
    ASSERT_NE(d[3], d2[3]);
}